

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

void CGL::Collada::ColladaParser::parse_sphere(XMLElement *xml,SphereInfo *sphere)

{
  XMLElement *pXVar1;
  char *__nptr;
  double dVar2;
  allocator local_39;
  string local_38;
  
  tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  std::__cxx11::string::assign((char *)&(sphere->super_Instance).id);
  tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  std::__cxx11::string::assign((char *)&(sphere->super_Instance).name);
  (sphere->super_Instance).type = SPHERE;
  pXVar1 = get_technique_CGL(xml);
  if (pXVar1 != (XMLElement *)0x0) {
    std::__cxx11::string::string((string *)&local_38,"sphere/radius",&local_39);
    pXVar1 = get_element(pXVar1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (pXVar1 != (XMLElement *)0x0) {
      __nptr = tinyxml2::XMLElement::GetText(pXVar1);
      dVar2 = atof(__nptr);
      sphere->radius = (float)dVar2;
      return;
    }
  }
  exit(1);
}

Assistant:

void ColladaParser::parse_sphere(XMLElement* xml, SphereInfo& sphere) {

  // name & id
  sphere.id   = xml->Attribute( "id" );
  sphere.name = xml->Attribute("name");
  sphere.type = Instance::SPHERE;

  XMLElement* e_technique = get_technique_CGL(xml);
  if (!e_technique) {
    stat("Error: no 462 profile technique in geometry: " << sphere.id);
    exit(EXIT_FAILURE);
  }

  XMLElement* e_radius = get_element(e_technique, "sphere/radius");
  if (!e_radius) {
    stat("Error: invalid sphere definition in geometry: " << sphere.id);
    exit(EXIT_FAILURE);
  }

  sphere.radius = atof(e_radius->GetText());

  // print summary
  stat("  |- " << sphere);
}